

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::PipelineCacheComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PipelineCacheComputeTestInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  VkDevice_s *pVVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  long *plVar5;
  Allocator *allocator;
  pointer pcVar6;
  bool bVar7;
  undefined4 uVar8;
  DeviceInterface *pDVar9;
  pointer pSVar10;
  int iVar11;
  deUint32 dVar12;
  deUint64 *pdVar13;
  const_iterator cVar14;
  long *plVar15;
  int *piVar16;
  DescriptorSetLayoutBuilder *this_01;
  ThreadGroupThread *this_02;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  VkComputePipelineCreateInfo *pVVar21;
  iterator iVar22;
  long lVar23;
  MultiQueues *queues_00;
  byte bVar24;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfo;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStageInfos;
  ThreadGroup threads;
  ShaderModuleVector shaderCompModules;
  MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  queues;
  VkPipelineCacheCreateInfo pipelineCacheInfo;
  VkComputePipelineCreateInfo *local_368;
  iterator iStack_360;
  VkComputePipelineCreateInfo *local_358;
  void *local_348;
  iterator iStack_340;
  VkPipelineShaderStageCreateInfo *local_338;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  DeviceInterface *local_308;
  VkDevice_s *local_300;
  Buffer local_2f8;
  ThreadGroup local_2c8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  local_2a8;
  PipelineCacheComputeTestInstance *local_288;
  DeviceInterface *local_280;
  long *local_278;
  long local_270;
  long local_268 [2];
  MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
  local_258;
  UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  local_248;
  Move<vk::Handle<(vk::HandleType)16>_> local_238;
  Move<vk::Handle<(vk::HandleType)15>_> local_218;
  Move<vk::Handle<(vk::HandleType)18>_> local_1f8;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  VkShaderModule VStack_1c0;
  pointer local_1b8;
  VkSpecializationInfo *pVStack_1b0;
  VkShaderModule local_1a8;
  pointer local_1a0;
  VkSpecializationInfo *pVStack_198;
  VkPipelineLayout local_190;
  VkPipeline local_188;
  deInt32 local_180;
  ios_base local_168 [272];
  TestStatus local_58;
  
  bVar24 = 0;
  local_308 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_1d8._0_4_ = 2;
  createQueues((MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                *)&local_248,(this->super_TestInstance).m_context,(VkQueueFlags *)local_1d8);
  queues_00 = local_248.m_data.ptr;
  pVVar4 = ((local_248.m_data.ptr)->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_280 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_2a8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::resize(&local_2a8,
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  local_300 = pVVar4;
  if (0 < (int)((ulong)((long)(this->m_shadersExecutions).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_shadersExecutions).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar20 = 8;
    lVar23 = 0;
    local_288 = this;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"compute_",8);
      std::ostream::operator<<((ostringstream *)local_1d8,(int)lVar23);
      pdVar13 = (deUint64 *)operator_new(0x20);
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      std::__cxx11::stringbuf::str();
      cVar14 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(this_00,(key_type *)local_328);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_2f8,local_280,local_300,
                 *(ProgramBinary **)(cVar14._M_node + 2),0);
      pdVar13[2] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_device;
      pdVar13[3] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_allocator;
      *pdVar13 = local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal;
      pdVar13[1] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_deviceIface;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar15 = (long *)operator_new(0x20);
      pSVar10 = local_2a8.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar15 + 1) = 0;
      *(undefined4 *)((long)plVar15 + 0xc) = 0;
      *plVar15 = (long)&PTR__SharedPtrState_00cef2f0;
      plVar15[2] = (long)pdVar13;
      *(undefined4 *)(plVar15 + 1) = 1;
      *(undefined4 *)((long)plVar15 + 0xc) = 1;
      plVar5 = *(long **)((long)&(local_2a8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar20);
      if (plVar5 != plVar15) {
        if (plVar5 != (long *)0x0) {
          LOCK();
          plVar5 = plVar5 + 1;
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            *(undefined8 *)
             ((long)local_2a8.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_2a8.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar20) + 0x10))();
          }
          LOCK();
          piVar16 = (int *)(*(long *)((long)&pSVar10->m_ptr + lVar20) + 0xc);
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            plVar5 = *(long **)((long)&pSVar10->m_ptr + lVar20);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(undefined8 *)((long)&pSVar10->m_ptr + lVar20) = 0;
          }
        }
        *(deUint64 **)((long)pSVar10 + lVar20 + -8) = pdVar13;
        *(long **)((long)&pSVar10->m_ptr + lVar20) = plVar15;
        LOCK();
        *(int *)(plVar15 + 1) = (int)plVar15[1] + 1;
        UNLOCK();
        LOCK();
        piVar16 = (int *)(*(long *)((long)&pSVar10->m_ptr + lVar20) + 0xc);
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      plVar5 = plVar15 + 1;
      LOCK();
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*plVar15 + 0x10))(plVar15);
      }
      piVar16 = (int *)((long)plVar15 + 0xc);
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        (**(code **)(*plVar15 + 8))(plVar15);
      }
      this = local_288;
      if (local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
          != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
                   &local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                   (VkShaderModule)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal);
      }
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ != &local_318) {
        operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      lVar23 = lVar23 + 1;
      lVar20 = lVar20 + 0x10;
      queues_00 = local_248.m_data.ptr;
    } while (lVar23 < (int)((ulong)((long)(this->m_shadersExecutions).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shadersExecutions).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pVVar4 = local_300;
  allocator = (queues_00->m_allocator).
              super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_1d8,0x40,0x20);
  synchronization::Buffer::Buffer
            (&local_2f8,local_308,pVVar4,allocator,(VkBufferCreateInfo *)local_1d8,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_1d8);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_1d8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,
                       0x20,(VkSampler *)0x0);
  pDVar9 = local_308;
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_328,this_01,local_308,pVVar4,0);
  if ((pointer)local_1a8.m_internal != (pointer)0x0) {
    operator_delete((void *)local_1a8.m_internal,(long)pVStack_198 - local_1a8.m_internal);
  }
  if ((pointer)VStack_1c0.m_internal != (pointer)0x0) {
    operator_delete((void *)VStack_1c0.m_internal,(long)pVStack_1b0 - VStack_1c0.m_internal);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
  }
  makePipelineLayout(&local_238,pDVar9,pVVar4,(VkDescriptorSetLayout)local_328._0_8_);
  local_348 = (void *)0x0;
  iStack_340._M_current = (VkPipelineShaderStageCreateInfo *)0x0;
  local_338 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_1d8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)0x2000000000;
  local_1b8 = (pointer)0xac0965;
  pVStack_1b0 = (VkSpecializationInfo *)0x0;
  if ((int)((ulong)((long)(this->m_shadersExecutions).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_shadersExecutions).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < 1) {
    bVar7 = false;
  }
  else {
    lVar20 = 0;
    lVar23 = 0;
    do {
      VStack_1c0.m_internal =
           **(deUint64 **)
             ((long)&(local_2a8.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar20);
      if (iStack_340._M_current == local_338) {
        std::
        vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
        ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
                  ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                    *)&local_348,iStack_340,(VkPipelineShaderStageCreateInfo *)local_1d8);
      }
      else {
        (iStack_340._M_current)->pName = (char *)local_1b8;
        (iStack_340._M_current)->pSpecializationInfo = pVStack_1b0;
        *(pointer *)&(iStack_340._M_current)->flags = local_1c8;
        ((iStack_340._M_current)->module).m_internal = VStack_1c0.m_internal;
        *(undefined8 *)iStack_340._M_current = local_1d8._0_8_;
        (iStack_340._M_current)->pNext = (void *)local_1d8._8_8_;
        iStack_340._M_current = iStack_340._M_current + 1;
      }
      lVar23 = lVar23 + 1;
      iVar11 = (int)((ulong)((long)(this->m_shadersExecutions).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_shadersExecutions).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar20 = lVar20 + 0x10;
    } while (lVar23 < iVar11);
    bVar7 = 0 < iVar11;
  }
  local_368 = (VkComputePipelineCreateInfo *)0x0;
  iStack_360._M_current = (VkComputePipelineCreateInfo *)0x0;
  local_358 = (VkComputePipelineCreateInfo *)0x0;
  local_1d8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)((ulong)local_1c8 & 0xffffffff00000000);
  local_190.m_internal =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_188.m_internal = 0;
  local_180 = 0;
  if (bVar7) {
    lVar23 = 0;
    lVar20 = 0;
    do {
      puVar2 = (undefined8 *)((long)local_348 + lVar23 + 0x10);
      puVar3 = (undefined8 *)((long)local_348 + lVar23 + 0x20);
      local_1a0 = (pointer)*puVar3;
      pVStack_198 = (VkSpecializationInfo *)puVar3[1];
      pVStack_1b0 = (VkSpecializationInfo *)*puVar2;
      local_1a8.m_internal = (deUint64)puVar2[1];
      VStack_1c0.m_internal = (deUint64)*(pointer *)((long)local_348 + lVar23);
      local_1b8 = (pointer)((VkDeviceSize *)((long)local_348 + lVar23))[1];
      if (iStack_360._M_current == local_358) {
        std::vector<vk::VkComputePipelineCreateInfo,std::allocator<vk::VkComputePipelineCreateInfo>>
        ::_M_realloc_insert<vk::VkComputePipelineCreateInfo_const&>
                  ((vector<vk::VkComputePipelineCreateInfo,std::allocator<vk::VkComputePipelineCreateInfo>>
                    *)&local_368,iStack_360,(VkComputePipelineCreateInfo *)local_1d8);
      }
      else {
        pVVar21 = (VkComputePipelineCreateInfo *)local_1d8;
        iVar22._M_current = iStack_360._M_current;
        for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
          uVar8 = *(undefined4 *)&pVVar21->field_0x4;
          (iVar22._M_current)->sType = pVVar21->sType;
          *(undefined4 *)&(iVar22._M_current)->field_0x4 = uVar8;
          pVVar21 = (VkComputePipelineCreateInfo *)((long)pVVar21 + (ulong)bVar24 * -0x10 + 8);
          iVar22._M_current = iVar22._M_current + (ulong)bVar24 * -0x10 + 8;
        }
        iStack_360._M_current = iStack_360._M_current + 1;
      }
      lVar20 = lVar20 + 1;
      lVar23 = lVar23 + 0x30;
    } while (lVar20 < (int)((ulong)((long)(this->m_shadersExecutions).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shadersExecutions).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pVVar4 = local_300;
  pDVar9 = local_308;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)0x0;
  VStack_1c0.m_internal = 0;
  local_1b8 = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x11;
  ::vk::createPipelineCache
            (&local_218,local_308,local_300,(VkPipelineCacheCreateInfo *)local_1d8,
             (VkAllocationCallbacks *)0x0);
  ::vk::createComputePipeline
            (&local_1f8,pDVar9,pVVar4,
             (VkPipelineCache)
             local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
             local_368,(VkAllocationCallbacks *)0x0);
  dVar12 = deGetNumAvailableLogicalCores();
  uVar17 = 0x20;
  if (dVar12 < 0x20) {
    uVar17 = dVar12;
  }
  uVar19 = 4;
  if (4 < uVar17) {
    uVar19 = uVar17;
  }
  local_2c8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  executeComputePipeline
            (&local_58,(this->super_TestInstance).m_context,(VkPipeline *)&local_1f8,
             (VkPipelineLayout *)&local_238,(VkDescriptorSetLayout *)local_328,queues_00,
             (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_description._M_dataplus._M_p != &local_58.m_description.field_2) {
    operator_delete(local_58.m_description._M_dataplus._M_p,
                    local_58.m_description.field_2._M_allocated_capacity + 1);
  }
  do {
    this_02 = (ThreadGroupThread *)operator_new(0xa0);
    ThreadGroupThread::ThreadGroupThread
              (this_02,(this->super_TestInstance).m_context,
               (VkPipelineCache)
               local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
               (VkPipelineLayout *)&local_238,(VkDescriptorSetLayout *)local_328,queues_00,
               &this->m_shadersExecutions);
    (this_02->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d027b8;
    this_02[1].super_Thread._vptr_Thread = (_func_int **)&local_368;
    local_258.
    super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_02;
    ThreadGroup::add(&local_2c8,&local_258);
    if (local_258.
        super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_258.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_258.
      super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    uVar19 = uVar19 - 1;
  } while (uVar19 != 0);
  ThreadGroup::run(__return_storage_ptr__,&local_2c8);
  if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
    pcVar6 = (__return_storage_ptr__->m_description)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_description).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != paVar1) {
      operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
    }
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_278,
               local_270 + (long)local_278);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  ThreadGroup::~ThreadGroup(&local_2c8);
  if (local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              (&local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
               (VkPipelineCache)
               local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
  }
  if (local_368 != (VkComputePipelineCreateInfo *)0x0) {
    operator_delete(local_368,(long)local_358 - (long)local_368);
  }
  if (local_348 != (void *)0x0) {
    operator_delete(local_348,(long)local_338 - (long)local_348);
  }
  if (local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if ((pointer)local_328._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_328 + 8),
               (VkDescriptorSetLayout)local_328._0_8_);
  }
  if (local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector(&local_2a8);
  de::details::
  UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  ::~UniqueBase(&local_248);
  return __return_storage_ptr__;
}

Assistant:

TestStatus	iterate								(void)
	{
		const DeviceInterface&					vk					= m_context.getDeviceInterface();
		MovePtr<MultiQueues>					queues				= createQueues(m_context, VK_QUEUE_COMPUTE_BIT);
		const VkDevice							device				= queues->getDevice();
		ShaderModuleVector						shaderCompModules	= addShaderModules(device);
		Buffer									resultBuffer		(vk, device, *queues->m_allocator, makeBufferCreateInfo(BUFFER_SIZE, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);
		const Move<VkDescriptorSetLayout>		descriptorSetLayout	(DescriptorSetLayoutBuilder()
																		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
																		.build(vk, device));
		const Move<VkPipelineLayout>			pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
		vector<VkPipelineShaderStageCreateInfo>	shaderStageInfos	= addShaderStageInfo(shaderCompModules);
		vector<VkComputePipelineCreateInfo>		pipelineInfo		= addPipelineInfo(*pipelineLayout, shaderStageInfos);
		const VkPipelineCacheCreateInfo			pipelineCacheInfo	=
																	{
																		VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,	// VkStructureType             sType;
																		DE_NULL,										// const void*                 pNext;
																		0u,												// VkPipelineCacheCreateFlags  flags;
																		0u,												// deUintptr                   initialDataSize;
																		DE_NULL,										// const void*                 pInitialData;
																	};
		Move<VkPipelineCache>					pipelineCache		= createPipelineCache(vk, device, &pipelineCacheInfo);
		Move<VkPipeline>						pipeline			= createComputePipeline(vk, device, *pipelineCache, &pipelineInfo[0]);
		const deUint32							numThreads			= clamp(deGetNumAvailableLogicalCores(), 4u, 32u);
		ThreadGroup								threads;

		executeComputePipeline(m_context, *pipeline, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions[0]);

		for (deUint32 ndx = 0; ndx < numThreads; ++ndx)
			threads.add(MovePtr<ThreadGroupThread>(new CreateComputeThread(
				m_context, *pipelineCache, pipelineInfo, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions)));

		{
			TestStatus thread_result = threads.run();
			if(thread_result.getCode())
			{
				return thread_result;
			}
		}
		return TestStatus::pass("Passed");
	}